

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

RecyclableObject *
Js::JavascriptArray::ObjectSpliceHelper<unsigned_long>
          (RecyclableObject *pObj,unsigned_long len,unsigned_long start,unsigned_long deleteLen,
          Var *insertArgs,uint32 insertLen,ScriptContext *scriptContext,RecyclableObject *pNewObj)

{
  bool bVar1;
  BOOL BVar2;
  uint uVar3;
  JavascriptArray *pJVar4;
  JavascriptCopyOnAccessNativeIntArray *this;
  Var pvVar5;
  ScriptContext *scriptContext_00;
  ScriptContext *scriptContext_01;
  uint64 uVar6;
  uint64 index;
  unsigned_long uVar7;
  ulong uVar8;
  BigIndex index_00;
  BigIndex idxDest;
  BigIndex local_b0;
  Var *local_a0;
  JavascriptArray *local_98;
  JavascriptArray *local_90;
  ulong local_88;
  uint32 local_7c;
  unsigned_long local_78;
  unsigned_long local_70;
  undefined1 local_68 [8];
  BigIndex k;
  undefined1 local_50 [8];
  JsReentLock jsReentLock;
  
  local_50 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_50)->noJsReentrancy;
  ((ThreadContext *)local_50)->noJsReentrancy = true;
  local_a0 = insertArgs;
  local_7c = insertLen;
  JsReentLock::setObjectForMutation((JsReentLock *)local_50,pObj);
  if (pNewObj == (RecyclableObject *)0x0) {
    *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    insertArgs = (Var *)0x0;
    pNewObj = ArraySpeciesCreate<unsigned_long>
                        (pObj,deleteLen,scriptContext,(bool *)0x0,(bool *)0x0,(bool *)0x0);
    *(bool *)((long)local_50 + 0x108) = true;
    if ((JavascriptArray *)pNewObj == (JavascriptArray *)0x0) {
      if (deleteLen >> 0x20 != 0) {
        JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec5b,(PCWSTR)0x0);
      }
      pNewObj = (RecyclableObject *)
                JavascriptLibrary::CreateArray
                          ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                           (uint32)deleteLen);
      if ((((JavascriptArray *)pNewObj)->head).ptr == EmptySegment) {
        AllocateHead<void*>((JavascriptArray *)pNewObj);
      }
    }
  }
  bVar1 = IsNonES5Array(pNewObj);
  local_98 = (JavascriptArray *)pNewObj;
  local_78 = start;
  local_70 = len;
  k.bigIndex = deleteLen;
  if ((bVar1) &&
     (pJVar4 = UnsafeVarTo<Js::JavascriptArray>(pNewObj), pJVar4 != (JavascriptArray *)0x0)) {
    bVar1 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar4);
    if ((bVar1) &&
       (this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar4),
       this != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
    }
    JsReentLock::setSecondObjectForMutation((JsReentLock *)local_50,pJVar4);
    bVar1 = false;
    local_90 = pJVar4;
    if (deleteLen != 0) {
      uVar8 = 0;
      do {
        *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        uVar6 = uVar8 + local_78;
        BVar2 = JavascriptOperators::HasItem(pObj,uVar6);
        JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        *(bool *)((long)local_50 + 0x108) = true;
        if (BVar2 != 0) {
          *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          pvVar5 = JavascriptOperators::GetItem(pObj,uVar6,scriptContext);
          JsReentLock::MutateArrayObject((JsReentLock *)local_50);
          *(bool *)((long)local_50 + 0x108) = true;
          (*(local_90->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                    (local_90,uVar8,pvVar5,0);
        }
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (uVar8 < k.bigIndex);
      bVar1 = false;
      start = local_78;
      deleteLen = k.bigIndex;
      len = local_70;
    }
  }
  else {
    BigIndex::BigIndex((BigIndex *)local_68,0);
    if (deleteLen != 0) {
      uVar6 = k.bigIndex;
      uVar7 = local_78;
      do {
        *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BVar2 = JavascriptOperators::HasItem(pObj,uVar7);
        JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        *(bool *)((long)local_50 + 0x108) = true;
        if (BVar2 != 0) {
          *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          pvVar5 = JavascriptOperators::GetItem(pObj,uVar7,scriptContext);
          idxDest.bigIndex = (uint64)pvVar5;
          idxDest.index = k.index;
          idxDest._4_4_ = k._4_4_;
          uVar3 = SetArrayLikeObjects(local_98,(RecyclableObject *)(ulong)(uint)local_68._0_4_,
                                      idxDest,insertArgs);
          index_00.bigIndex = (uint64)insertArgs;
          index_00.index = k.index;
          index_00._4_4_ = k._4_4_;
          ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar3,(BOOL)scriptContext,
                              (ScriptContext *)(ulong)(uint)local_68._0_4_,index_00);
          JsReentLock::MutateArrayObject((JsReentLock *)local_50);
          *(bool *)((long)local_50 + 0x108) = true;
        }
        if (local_68._0_4_ == 0xffffffff) {
          k._0_8_ = k._0_8_ + 1;
        }
        else {
          local_68._0_4_ = local_68._0_4_ + 1;
        }
        uVar7 = uVar7 + 1;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    bVar1 = true;
    local_90 = (JavascriptArray *)0x0;
    start = local_78;
    deleteLen = k.bigIndex;
    len = local_70;
  }
  local_88 = (ulong)local_7c;
  if (deleteLen < local_88) {
    *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    BigIndex::BigIndex((BigIndex *)local_68,local_88 + start);
    Unshift<Js::JavascriptArray::BigIndex,unsigned_long>
              (pObj,(BigIndex *)local_68,deleteLen + start,len,scriptContext);
    JsReentLock::MutateArrayObject((JsReentLock *)local_50);
    *(bool *)((long)local_50 + 0x108) = true;
  }
  else if (local_88 < deleteLen) {
    uVar6 = deleteLen + start;
    if (uVar6 < len) {
      index = start + local_88;
      do {
        *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BVar2 = JavascriptOperators::HasItem(pObj,uVar6);
        JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        *(bool *)((long)local_50 + 0x108) = true;
        *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        if (BVar2 == 0) {
          BVar2 = JavascriptOperators::DeleteItem
                            (pObj,index,PropertyOperation_ThrowOnDeleteIfNotConfig);
          if (BVar2 == 0) {
            JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
          }
          JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        }
        else {
          pvVar5 = JavascriptOperators::GetItem(pObj,uVar6,scriptContext);
          BVar2 = JavascriptOperators::SetItem
                            (pObj,pObj,index,pvVar5,scriptContext,
                             PropertyOperation_ThrowIfNotExtensible);
          if (BVar2 == 0) {
            JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
          }
          JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        }
        *(bool *)((long)local_50 + 0x108) = true;
        uVar6 = uVar6 + 1;
        index = index + 1;
      } while (uVar6 < local_70);
    }
    uVar8 = (local_70 - k.bigIndex) + local_88;
    if (uVar8 < local_70) {
      uVar7 = local_70;
      do {
        *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        uVar7 = uVar7 - 1;
        BVar2 = JavascriptOperators::DeleteItem
                          (pObj,uVar7,PropertyOperation_ThrowOnDeleteIfNotConfig);
        if (BVar2 == 0) {
          JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
        }
        JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        *(bool *)((long)local_50 + 0x108) = true;
      } while (uVar8 < uVar7);
    }
  }
  if (local_7c != 0) {
    uVar8 = 0;
    do {
      *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      BigIndex::BigIndex((BigIndex *)local_68,local_78 + uVar8);
      BVar2 = BigIndex::SetItem((BigIndex *)local_68,pObj,local_a0[uVar8],
                                PropertyOperation_ThrowIfNotExtensible);
      if (BVar2 == 0) {
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
      }
      JsReentLock::MutateArrayObject((JsReentLock *)local_50);
      *(bool *)((long)local_50 + 0x108) = true;
      uVar8 = uVar8 + 1;
    } while (local_88 != uVar8);
  }
  scriptContext_01 = (ScriptContext *)k.bigIndex;
  scriptContext_00 = (ScriptContext *)((local_70 - k.bigIndex) + local_88);
  *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  BigIndex::BigIndex((BigIndex *)local_68,(uint64)scriptContext_00);
  pvVar5 = BigIndex::ToNumber((BigIndex *)local_68,scriptContext_00);
  BVar2 = JavascriptOperators::SetProperty
                    (pObj,pObj,0xd1,pvVar5,scriptContext,PropertyOperation_ThrowIfNotExtensible);
  pJVar4 = local_98;
  if (BVar2 == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
  }
  BigIndex::BigIndex(&local_b0,(uint64)scriptContext_01);
  pvVar5 = BigIndex::ToNumber(&local_b0,scriptContext_01);
  BVar2 = JavascriptOperators::SetProperty
                    (pJVar4,(RecyclableObject *)pJVar4,0xd1,pvVar5,scriptContext,
                     PropertyOperation_ThrowIfNotExtensible);
  if (BVar2 == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
  }
  JsReentLock::MutateArrayObject((JsReentLock *)local_50);
  *(bool *)((long)local_50 + 0x108) = true;
  if (!bVar1) {
    (*(local_90->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
  }
  ((ThreadContext *)local_50)->noJsReentrancy = (bool)jsReentLock.m_arrayObject2._0_1_;
  return (RecyclableObject *)pJVar4;
}

Assistant:

RecyclableObject* JavascriptArray::ObjectSpliceHelper(RecyclableObject* pObj, T len, T start,
        T deleteLen, Var* insertArgs, uint32 insertLen, ScriptContext *scriptContext, RecyclableObject* pNewObj)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pObj);

        JavascriptArray *pnewArr = nullptr;

        if (pNewObj == nullptr)
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, pNewObj = ArraySpeciesCreate(pObj, deleteLen, scriptContext));
            if (pNewObj == nullptr)
            {
                if (deleteLen > UINT_MAX)
                {
                    JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
                }

                pnewArr = scriptContext->GetLibrary()->CreateArray(static_cast<uint32>(deleteLen));
                pnewArr->EnsureHead<Var>();

                pNewObj = pnewArr;
            }
        }

        pnewArr = JavascriptArray::TryVarToNonES5Array(pNewObj);
        if (pnewArr)
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(pnewArr);
#endif
            SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, pnewArr);
        }

        // copy elements to delete to new array
        if (pnewArr != nullptr)
        {
            for (uint32 i = 0; i < deleteLen; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, start + i));
                if (hasItem)
                {
                    JS_REENTRANT(jsReentLock, Var element = JavascriptOperators::GetItem(pObj, start + i, scriptContext));
                    pnewArr->SetItem(i, element, PropertyOperation_None);
                }
            }
        }
        else
        {
            BigIndex k = 0u;
            for (T i = 0u; i < deleteLen; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, start + i));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(pObj, start + i, scriptContext),
                        ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(pNewObj, k, element), scriptContext, k));
                }
                ++k;
            }
        }

        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.splice"));

        // Now we need reserve room if it is necessary
        if (insertLen > deleteLen) // Might overflow max array length
        {
            // Unshift [start + deleteLen, len) to start + insertLen
            JS_REENTRANT(jsReentLock, Unshift<BigIndex, T>(pObj, start + insertLen, start + deleteLen, len, scriptContext));
        }
        else if (insertLen < deleteLen) // Won't overflow max array length
        {
            T j = 0;
            for (T i = start + deleteLen; i < len; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, i));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(pObj, i, scriptContext),
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(pObj, pObj, start + insertLen + j, element, scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock,
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(pObj, start + insertLen + j, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }
                j++;
            }

            // Clean up the rest
            for (T i = len; i > len - deleteLen + insertLen; i--)
            {
                JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(pObj, i - 1, PropertyOperation_ThrowOnDeleteIfNotConfig)));
            }
        }

        if (insertLen > 0)
        {
            T dstIndex = start; // insert index might overflow max array length
            for (uint32 i = 0; i < insertLen; i++)
            {
                JS_REENTRANT(jsReentLock,
                    h.ThrowTypeErrorOnFailure(IndexTrace<BigIndex>::SetItem(pObj, dstIndex, insertArgs[i], PropertyOperation_ThrowIfNotExtensible)));
                ++dstIndex;
            }
        }

        // Set up new length
        T newLen = T(len - deleteLen) + insertLen;
        JS_REENTRANT(jsReentLock,
            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(pObj, pObj, PropertyIds::length, IndexTrace<BigIndex>::ToNumber(newLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)),
            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(pNewObj, pNewObj, PropertyIds::length, IndexTrace<BigIndex>::ToNumber(deleteLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)));
#ifdef VALIDATE_ARRAY
        if (pnewArr)
        {
            pnewArr->ValidateArray();
        }
#endif
        return pNewObj;
    }